

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_text::as_bool(xml_text *this,bool def)

{
  xml_node_struct *pxVar1;
  byte in_SIL;
  char_t *value;
  xml_node_struct *d;
  bool local_29;
  xml_text *in_stack_ffffffffffffffd8;
  bool local_1;
  
  local_29 = (bool)(in_SIL & 1);
  pxVar1 = _data(in_stack_ffffffffffffffd8);
  local_1 = local_29;
  if (pxVar1 != (xml_node_struct *)0x0) {
    if (pxVar1->value != (char_t *)0x0) {
      local_29 = impl::anon_unknown_0::get_value_bool(pxVar1->value);
    }
    local_1 = local_29;
  }
  return local_1;
}

Assistant:

PUGI_IMPL_FN bool xml_text::as_bool(bool def) const
	{
		xml_node_struct* d = _data();
		if (!d) return def;
		const char_t* value = d->value;
		return value ? impl::get_value_bool(value) : def;
	}